

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mySet.cpp
# Opt level: O0

mySet<float,_myComparator<float>_> * __thiscall
mySet<float,_myComparator<float>_>::operator=
          (mySet<float,_myComparator<float>_> *this,mySet<float,_myComparator<float>_> *ob)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  float *pfVar3;
  int local_1c;
  int i;
  mySet<float,_myComparator<float>_> *ob_local;
  mySet<float,_myComparator<float>_> *this_local;
  
  if (this != ob) {
    if (this->data != (float *)0x0) {
      operator_delete__(this->data);
    }
    this->data_size = ob->data_size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(ob->data_size + 2);
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pfVar3 = (float *)operator_new__(uVar2);
    this->data = pfVar3;
    for (local_1c = 1; local_1c < this->data_size + 1; local_1c = local_1c + 1) {
      this->data[local_1c] = ob->data[local_1c];
    }
  }
  return this;
}

Assistant:

mySet<T, C>& mySet<T, C>::operator=(mySet<T, C>const& ob)
{
    if(this != &ob)
    {
            delete[] data;
            data_size = ob.data_size;
            data = new T[ob.data_size+2];
            for(int i =1; i < data_size+1; i++)
            data[i] = ob.data[i];
    }
    return *this;
}